

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double psi(double *xx)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double local_18;
  
  ipmpar::imach[1] = 2;
  ipmpar::imach[2] = 0x1f;
  ipmpar::imach[3] = 0x7fffffff;
  ipmpar::imach[4] = 2;
  ipmpar::imach[5] = 0x18;
  ipmpar::imach[6] = -0x7d;
  ipmpar::imach[7] = 0x80;
  ipmpar::imach[8] = 0x35;
  ipmpar::imach[9] = -0x3fd;
  ipmpar::imach[10] = 0x400;
  psi::xmax1 = 2147483647.0;
  dVar10 = spmpar(&psi::K2);
  psi::xmax1 = 2147483647.0;
  if (1.0 / dVar10 <= 2147483647.0) {
    psi::xmax1 = 1.0 / dVar10;
  }
  psi::x = *xx;
  psi::aug = 0.0;
  if (psi::x < 0.5) {
    if (ABS(psi::x) <= 1e-09) {
      if ((psi::x == 0.0) && (!NAN(psi::x))) {
        psi::aug = 0.0;
        return 0.0;
      }
      psi::aug = -1.0 / psi::x;
    }
    else {
      psi::sgn = 0.785398163397448;
      psi::w = -psi::x;
      if (-psi::x <= psi::x) {
        psi::sgn = -0.785398163397448;
        psi::w = psi::x;
      }
      if (psi::xmax1 <= psi::w) {
        psi::aug = 0.0;
        return 0.0;
      }
      dVar11 = psi::w - (double)(~-(ulong)(psi::w < 1.0) & (ulong)(double)(int)(long)psi::w);
      dVar10 = dVar11 * 4.0;
      uVar3 = (long)dVar10 & 0xffffffff;
      if (dVar10 < 1.0) {
        uVar3 = 0;
      }
      uVar1 = (uint)uVar3;
      psi::w = ((double)(int)uVar1 * -0.25 + dVar11) * 4.0;
      uVar6 = (int)(uVar3 >> 0x1f) + uVar1;
      if ((uVar6 & 0xfffffffe) != uVar1) {
        psi::w = 1.0 - psi::w;
      }
      psi::z = psi::w * 0.785398163397448;
      uVar7 = uVar1 + 3;
      if (-1 < (int)uVar1) {
        uVar7 = uVar1;
      }
      if (((int)uVar7 >> 2) * 2 != (int)uVar6 >> 1) {
        psi::sgn = -psi::sgn;
      }
      dVar10 = psi::sgn;
      iVar5 = uVar1 + 1;
      iVar2 = uVar1 + 4;
      if (-1 < iVar5) {
        iVar2 = iVar5;
      }
      if ((iVar2 >> 2) * 2 == (int)((uVar1 - (iVar5 >> 0x1f)) + 1) >> 1) {
        if ((psi::z == 0.0) && (!NAN(psi::z))) {
          psi::aug = 0.0;
          return 0.0;
        }
        local_18 = cos(psi::z);
        dVar11 = sin(psi::z);
        uVar8 = SUB84(dVar11,0);
        uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
      }
      else {
        local_18 = sin(psi::z);
        dVar11 = cos(psi::z);
        uVar8 = SUB84(dVar11,0);
        uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
      }
      psi::aug = (local_18 / (double)CONCAT44(uVar9,uVar8)) * 4.0 * dVar10;
    }
    psi::x = 1.0 - psi::x;
  }
  if (psi::x <= 3.0) {
    dVar11 = psi::x * 0.0089538502298197;
    lVar4 = 0;
    dVar10 = psi::x;
    do {
      dVar10 = (dVar10 + *(double *)((long)psi::q1 + lVar4)) * psi::x;
      dVar11 = (dVar11 + *(double *)((long)psi::p1 + lVar4 + 8)) * psi::x;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x28);
    dVar10 = (psi::x + -1.4616321449683622) *
             ((dVar11 + 1305.60269827897) / (dVar10 + 6.91091682714533e-06)) + psi::aug;
  }
  else {
    if (psi::x < psi::xmax1) {
      psi::w = 1.0 / (psi::x * psi::x);
      dVar11 = psi::w * -2.12940445131011;
      lVar4 = 0;
      dVar10 = psi::w;
      do {
        dVar10 = (dVar10 + *(double *)((long)psi::q2 + lVar4)) * psi::w;
        dVar11 = (dVar11 + *(double *)((long)psi::p2 + lVar4 + 8)) * psi::w;
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x18);
      psi::aug = -0.5 / psi::x + dVar11 / (dVar10 + 7.77788548522962) + psi::aug;
    }
    dVar11 = psi::aug;
    dVar10 = log(psi::x);
    dVar10 = dVar10 + dVar11;
  }
  return dVar10;
}

Assistant:

double psi(double *xx)
/*
---------------------------------------------------------------------

                 EVALUATION OF THE DIGAMMA FUNCTION

                           -----------

     PSI(XX) IS ASSIGNED THE VALUE 0 WHEN THE DIGAMMA FUNCTION CANNOT
     BE COMPUTED.

     THE MAIN COMPUTATION INVOLVES EVALUATION OF RATIONAL CHEBYSHEV
     APPROXIMATIONS PUBLISHED IN MATH. COMP. 27, 123-127(1973) BY
     CODY, STRECOK AND THACHER.

---------------------------------------------------------------------
     PSI WAS WRITTEN AT ARGONNE NATIONAL LABORATORY FOR THE FUNPACK
     PACKAGE OF SPECIAL FUNCTION SUBROUTINES. PSI WAS MODIFIED BY
     A.H. MORRIS (NSWC).
---------------------------------------------------------------------
*/
{
static double dx0 = 1.461632144968362341262659542325721325e0;
static double piov4 = .785398163397448e0;
static double p1[7] = {
    .895385022981970e-02,.477762828042627e+01,.142441585084029e+03,
    .118645200713425e+04,.363351846806499e+04,.413810161269013e+04,
    .130560269827897e+04
};
static double p2[4] = {
    -.212940445131011e+01,-.701677227766759e+01,-.448616543918019e+01,
    -.648157123766197e+00
};
static double q1[6] = {
    .448452573429826e+02,.520752771467162e+03,.221000799247830e+04,
    .364127349079381e+04,.190831076596300e+04,.691091682714533e-05
};
static double q2[4] = {
    .322703493791143e+02,.892920700481861e+02,.546117738103215e+02,
    .777788548522962e+01
};
static int K1 = 3;
static int K2 = 1;
static double psi,aug,den,sgn,upper,w,x,xmax1,xmx0,xsmall,z;
static int i,m,n,nq;
/*
     ..
     .. Executable Statements ..
*/
/*
---------------------------------------------------------------------
     MACHINE DEPENDENT CONSTANTS ...
        XMAX1  = THE SMALLEST POSITIVE FLOATING POINT CONSTANT
                 WITH ENTIRELY INTEGER REPRESENTATION.  ALSO USED
                 AS NEGATIVE OF LOWER BOUND ON ACCEPTABLE NEGATIVE
                 ARGUMENTS AND AS THE POSITIVE ARGUMENT BEYOND WHICH
                 PSI MAY BE REPRESENTED AS ALOG(X).
        XSMALL = ABSOLUTE ARGUMENT BELOW WHICH PI*COTAN(PI*X)
                 MAY BE REPRESENTED BY 1/X.
---------------------------------------------------------------------
*/
    xmax1 = ipmpar(&K1);
    xmax1 = fifdmin1(xmax1,1.0e0/spmpar(&K2));
    xsmall = 1.e-9;
    x = *xx;
    aug = 0.0e0;
    if(x >= 0.5e0) goto S50;
/*
---------------------------------------------------------------------
     X .LT. 0.5,  USE REFLECTION FORMULA
     PSI(1-X) = PSI(X) + PI * COTAN(PI*X)
---------------------------------------------------------------------
*/
    if(fabs(x) > xsmall) goto S10;
    if(x == 0.0e0) goto S100;
/*
---------------------------------------------------------------------
     0 .LT. ABS(X) .LE. XSMALL.  USE 1/X AS A SUBSTITUTE
     FOR  PI*COTAN(PI*X)
---------------------------------------------------------------------
*/
    aug = -(1.0e0/x);
    goto S40;
S10:
/*
---------------------------------------------------------------------
     REDUCTION OF ARGUMENT FOR COTAN
---------------------------------------------------------------------
*/
    w = -x;
    sgn = piov4;
    if(w > 0.0e0) goto S20;
    w = -w;
    sgn = -sgn;
S20:
/*
---------------------------------------------------------------------
     MAKE AN ERROR EXIT IF X .LE. -XMAX1
---------------------------------------------------------------------
*/
    if(w >= xmax1) goto S100;
    nq = fifidint(w);
    w -= (double)nq;
    nq = fifidint(w*4.0e0);
    w = 4.0e0*(w-(double)nq*.25e0);
/*
---------------------------------------------------------------------
     W IS NOW RELATED TO THE FRACTIONAL PART OF  4.0 * X.
     ADJUST ARGUMENT TO CORRESPOND TO VALUES IN FIRST
     QUADRANT AND DETERMINE SIGN
---------------------------------------------------------------------
*/
    n = nq/2;
    if(n+n != nq) w = 1.0e0-w;
    z = piov4*w;
    m = n/2;
    if(m+m != n) sgn = -sgn;
/*
---------------------------------------------------------------------
     DETERMINE FINAL VALUE FOR  -PI*COTAN(PI*X)
---------------------------------------------------------------------
*/
    n = (nq+1)/2;
    m = n/2;
    m += m;
    if(m != n) goto S30;
/*
---------------------------------------------------------------------
     CHECK FOR SINGULARITY
---------------------------------------------------------------------
*/
    if(z == 0.0e0) goto S100;
/*
---------------------------------------------------------------------
     USE COS/SIN AS A SUBSTITUTE FOR COTAN, AND
     SIN/COS AS A SUBSTITUTE FOR TAN
---------------------------------------------------------------------
*/
    aug = sgn*(cos(z)/sin(z)*4.0e0);
    goto S40;
S30:
    aug = sgn*(sin(z)/cos(z)*4.0e0);
S40:
    x = 1.0e0-x;
S50:
    if(x > 3.0e0) goto S70;
/*
---------------------------------------------------------------------
     0.5 .LE. X .LE. 3.0
---------------------------------------------------------------------
*/
    den = x;
    upper = p1[0]*x;
    for(i=1; i<=5; i++) {
        den = (den+q1[i-1])*x;
        upper = (upper+p1[i+1-1])*x;
    }
    den = (upper+p1[6])/(den+q1[5]);
    xmx0 = x-dx0;
    psi = den*xmx0+aug;
    return psi;
S70:
/*
---------------------------------------------------------------------
     IF X .GE. XMAX1, PSI = LN(X)
---------------------------------------------------------------------
*/
    if(x >= xmax1) goto S90;
/*
---------------------------------------------------------------------
     3.0 .LT. X .LT. XMAX1
---------------------------------------------------------------------
*/
    w = 1.0e0/(x*x);
    den = w;
    upper = p2[0]*w;
    for(i=1; i<=3; i++) {
        den = (den+q2[i-1])*w;
        upper = (upper+p2[i+1-1])*w;
    }
    aug = upper/(den+q2[3])-0.5e0/x+aug;
S90:
    psi = aug+log(x);
    return psi;
S100:
/*
---------------------------------------------------------------------
     ERROR RETURN
---------------------------------------------------------------------
*/
    psi = 0.0e0;
    return psi;
}